

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

double Joy_RemoveDeadZone(double axisval,double deadzone,BYTE *buttons)

{
  undefined1 local_21;
  BYTE butt;
  BYTE *buttons_local;
  double deadzone_local;
  double axisval_local;
  
  if (deadzone <= ABS(axisval)) {
    if (0.0 <= axisval) {
      deadzone_local = (axisval - deadzone) / (1.0 - deadzone);
      local_21 = '\x01';
    }
    else {
      deadzone_local = (axisval + deadzone) / (1.0 - deadzone);
      local_21 = '\x02';
    }
  }
  else {
    deadzone_local = 0.0;
    local_21 = '\0';
  }
  if (buttons != (BYTE *)0x0) {
    *buttons = local_21;
  }
  return deadzone_local;
}

Assistant:

double Joy_RemoveDeadZone(double axisval, double deadzone, BYTE *buttons)
{
	BYTE butt;

	// Cancel out deadzone.
	if (fabs(axisval) < deadzone)
	{
		axisval = 0;
		butt = 0;
	}
	// Make the dead zone the new 0.
	else if (axisval < 0)
	{
		axisval = (axisval + deadzone) / (1.0 - deadzone);
		butt = 2;	// button minus
	}
	else
	{
		axisval = (axisval - deadzone) / (1.0 - deadzone);
		butt = 1;	// button plus
	}
	if (buttons != NULL)
	{
		*buttons = butt;
	}
	return axisval;
}